

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

double __thiscall
ON_NurbsCurve::GetCubicBezierApproximation
          (ON_NurbsCurve *this,double max_deviation,ON_3dPoint *bezCV)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  bool bVar4;
  double dVar5;
  bool bVar6;
  ON_3dVector *__return_storage_ptr__;
  long lVar7;
  ON_3dPoint *pOVar8;
  uint cv_count;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar12;
  double dVar13;
  int hint;
  ON_3dPoint B;
  ON_3dPoint A;
  ON_Interval domain;
  ON_3dPoint P [2];
  ON_3dPoint bez1CV [4];
  ON_3dVector D [2];
  double g32 [32];
  double local_360;
  undefined4 local_33c;
  double local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [16];
  ON_3dPoint *local_308;
  ON_3dPoint *local_2f8;
  double local_2f0;
  ON_3dPoint local_2e8;
  ON_3dVector local_2d0;
  ON_Interval local_2b8;
  ON_3dPoint local_2a8;
  ON_3dPoint local_290;
  ON_3dPoint local_278;
  ON_3dPoint local_260;
  ON_3dPoint local_248;
  ON_3dPoint local_230;
  ON_3dPoint local_218;
  ON_3dPoint local_200;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  ON_3dPoint local_1d0;
  ON_3dPoint local_1b0;
  ON_3dPoint local_198;
  ON_3dVector local_180;
  ON_3dVector local_168;
  ON_3dVector local_150;
  ON_3dPoint local_138 [11];
  
  dVar5 = ON_DBL_QNAN;
  local_2f0 = max_deviation;
  bVar6 = ON_Object::ThisIsNullptr((ON_Object *)this,false);
  if (bVar6) {
    return dVar5;
  }
  iVar9 = this->m_order;
  if (iVar9 < 2) {
    return dVar5;
  }
  if (bezCV == (ON_3dPoint *)0x0 || this->m_cv_count < iVar9) {
    return dVar5;
  }
  if (((this->m_cv_count == 4) && (iVar9 == 4)) && (this->m_is_rat == 0)) {
    pdVar1 = this->m_knot;
    if (((*pdVar1 != pdVar1[2]) || (NAN(*pdVar1) || NAN(pdVar1[2]))) ||
       ((pdVar1[3] != pdVar1[5] || (NAN(pdVar1[3]) || NAN(pdVar1[5]))))) goto LAB_0053f319;
    GetCV(this,0,bezCV);
    GetCV(this,1,bezCV + 1);
    GetCV(this,2,bezCV + 2);
    GetCV(this,3,bezCV + 3);
    uVar10 = 0;
    uVar11 = 0;
LAB_0053fb4a:
    local_360 = (double)CONCAT44(uVar11,uVar10);
  }
  else {
LAB_0053f319:
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    local_290.z = ON_3dPoint::Origin.z;
    local_290.x = ON_3dPoint::Origin.x;
    local_290.y = ON_3dPoint::Origin.y;
    local_278.x = ON_3dPoint::Origin.x;
    local_278.y = ON_3dPoint::Origin.y;
    local_278.z = ON_3dPoint::Origin.z;
    local_218.z = ON_3dPoint::Origin.z;
    local_218.x = ON_3dPoint::Origin.x;
    local_218.y = ON_3dPoint::Origin.y;
    local_200.x = ON_3dPoint::Origin.x;
    local_200.y = ON_3dPoint::Origin.y;
    local_200.z = ON_3dPoint::Origin.z;
    local_1e8 = ON_3dPoint::Origin.x;
    dStack_1e0 = ON_3dPoint::Origin.y;
    local_1d8 = ON_3dPoint::Origin.z;
    local_1d0.x = ON_3dPoint::Origin.x;
    local_1d0.y = ON_3dPoint::Origin.y;
    local_1d0.z = ON_3dPoint::Origin.z;
    dVar12 = ON_Interval::operator[](&local_2b8,0);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
              (SUB84(dVar12,0),this,1,3,&local_218,0,0);
    dVar12 = ON_Interval::operator[](&local_2b8,1);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
              (SUB84(dVar12,0),this,1,3,&local_1e8,0,0);
    local_2a8.x = local_218.x;
    local_2a8.y = local_218.y;
    local_2a8.z = local_218.z;
    local_260.x = local_1e8;
    local_260.y = dStack_1e0;
    local_260.z = local_1d8;
    dVar12 = ON_Interval::operator[](&local_2b8,1);
    dVar13 = ON_Interval::operator[](&local_2b8,0);
    local_2f8 = bezCV;
    ::operator*(local_138,dVar12 - dVar13,&local_200);
    ON_3dVector::ON_3dVector(&local_168,local_138);
    ::operator*(&local_248,dVar12 - dVar13,&local_1d0);
    ON_3dVector::ON_3dVector(&local_150,&local_248);
    ON_3dVector::operator/((ON_3dVector *)&local_248,&local_168,3.0);
    ON_3dPoint::operator+(local_138,&local_2a8,(ON_3dVector *)&local_248);
    local_200.z = local_138[0].z;
    local_200.x = local_138[0].x;
    local_200.y = local_138[0].y;
    ON_3dVector::operator/((ON_3dVector *)&local_248,&local_150,3.0);
    ON_3dPoint::operator-(local_138,&local_260,(ON_3dVector *)&local_248);
    local_1d8 = local_138[0].z;
    local_1e8 = local_138[0].x;
    dStack_1e0 = local_138[0].y;
    local_1d0.x = local_260.x;
    local_1d0.y = local_260.y;
    local_1d0.z = local_260.z;
    local_248.z = ON_3dPoint::Origin.z;
    local_248.x = ON_3dPoint::Origin.x;
    local_248.y = ON_3dPoint::Origin.y;
    local_230.x = ON_3dPoint::Origin.x;
    local_230.y = ON_3dPoint::Origin.y;
    local_230.z = ON_3dPoint::Origin.z;
    local_33c = 0;
    dVar12 = ON_Interval::ParameterAt(&local_2b8,0.3333333333333333);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
              (SUB84(dVar12,0),this,0,3,&local_248,0,&local_33c);
    dVar12 = ON_Interval::ParameterAt(&local_2b8,0.6666666666666666);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
              (SUB84(dVar12,0),this,0,3,&local_230,0,&local_33c);
    ::operator*(&local_2e8,2.5,&local_2a8);
    ON_3dPoint::operator-(&local_2d0,&local_260,&local_2e8);
    ON_3dVector::operator/((ON_3dVector *)local_318,&local_2d0,3.0);
    ::operator*(&local_198,3.0,&local_248);
    ::operator*(&local_1b0,1.5,&local_230);
    ON_3dPoint::operator-(&local_180,&local_198,&local_1b0);
    ON_3dVector::operator+((ON_3dVector *)local_138,(ON_3dVector *)local_318,&local_180);
    ON_3dPoint::operator=(&local_290,(ON_3dVector *)local_138);
    ::operator*(&local_2e8,2.5,&local_260);
    ON_3dPoint::operator-(&local_2d0,&local_2a8,&local_2e8);
    ON_3dVector::operator/((ON_3dVector *)local_318,&local_2d0,3.0);
    ::operator*(&local_198,3.0,&local_230);
    ::operator*(&local_1b0,1.5,&local_248);
    ON_3dPoint::operator-(&local_180,&local_198,&local_1b0);
    pOVar8 = local_2f8;
    __return_storage_ptr__ = (ON_3dVector *)local_138;
    ON_3dVector::operator+(__return_storage_ptr__,(ON_3dVector *)local_318,&local_180);
    ON_3dPoint::operator=(&local_278,__return_storage_ptr__);
    iVar9 = this->m_order;
    cv_count = this->m_cv_count;
    if ((iVar9 == 4) && (cv_count == 4)) {
      dVar12 = 0.0;
      local_328 = 0.0;
      if (this->m_is_rat != 0) goto LAB_0053f7a9;
    }
    else {
LAB_0053f7a9:
      if (0x20 < (int)cv_count) {
        __return_storage_ptr__ = (ON_3dVector *)onmalloc((ulong)cv_count << 3);
        iVar9 = this->m_order;
        cv_count = this->m_cv_count;
      }
      ON_GetGrevilleAbcissae(iVar9,cv_count,this->m_knot,false,&__return_storage_ptr__->x);
      if (this->m_order == 3) {
        pdVar1 = this->m_knot;
        dVar12 = pdVar1[2];
        if (*pdVar1 <= dVar12 && dVar12 != *pdVar1) {
          __return_storage_ptr__->x = dVar12;
          __return_storage_ptr__->y = (pdVar1[2] + pdVar1[2] + pdVar1[3]) / 3.0;
        }
        lVar7 = (long)this->m_cv_count;
        if (pdVar1[lVar7] < pdVar1[lVar7 + 2]) {
          *(double *)((long)__return_storage_ptr__ + lVar7 * 8 + -8) = pdVar1[lVar7];
          *(double *)((long)__return_storage_ptr__ + lVar7 * 8 + -0x10) =
               (pdVar1[lVar7] + pdVar1[lVar7] + pdVar1[lVar7 + -1]) / 3.0;
        }
      }
      ON_BezierCurve::ON_BezierCurve((ON_BezierCurve *)local_318);
      local_318._0_8_ = 1.48219693752374e-323;
      local_318._8_8_ = 6.36598737487208e-314;
      local_308 = &local_2a8;
      ON_BezierCurve::Evaluate((ON_BezierCurve *)local_318,0.3333333333333333,0,3,&local_2d0.x);
      ON_BezierCurve::Evaluate((ON_BezierCurve *)local_318,0.6666666666666666,0,3,&local_2e8.x);
      dVar12 = ON_3dPoint::DistanceTo(&local_248,(ON_3dPoint *)&local_2d0);
      dVar13 = ON_3dPoint::DistanceTo(&local_230,&local_2e8);
      dVar12 = (dVar12 + dVar13) * 16.0 + 1e-14;
      local_338 = 0.0;
      uStack_330 = 0;
      local_328 = 0.0;
      uStack_320 = 0;
      if (1 < this->m_cv_count) {
        lVar7 = 1;
        local_328 = 0.0;
        uStack_320 = 0;
        local_338 = 0.0;
        uStack_330 = 0;
        do {
          bVar6 = true;
          do {
            bVar4 = bVar6;
            if (bVar4) {
              dVar13 = (*(double *)((long)__return_storage_ptr__ + lVar7 * 8 + -8) +
                       (&__return_storage_ptr__->x)[lVar7]) * 0.5;
            }
            else {
              dVar13 = (&__return_storage_ptr__->x)[lVar7];
            }
            dVar2 = ON_Interval::NormalizedParameterAt(&local_2b8,dVar13);
            if ((0.0 < dVar2) && (dVar2 < 1.0)) {
              (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
                        (SUB84(dVar13,0),this,0,3,(ON_3dPoint *)&local_2d0,0,&local_33c);
              local_308 = &local_2a8;
              ON_BezierCurve::Evaluate((ON_BezierCurve *)local_318,dVar2,0,3,&local_2e8.x);
              dVar13 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_2d0,&local_2e8);
              local_308 = &local_218;
              ON_BezierCurve::Evaluate((ON_BezierCurve *)local_318,dVar2,0,3,&local_2e8.x);
              dVar2 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_2d0,&local_2e8);
              uVar10 = SUB84(dVar2,0);
              uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
              if (dVar13 <= local_338) {
                dVar13 = local_338;
              }
              if (dVar2 <= local_328) {
                uVar10 = SUB84(local_328,0);
                uVar11 = (undefined4)((ulong)local_328 >> 0x20);
              }
              local_338 = dVar13;
              if ((local_2f0 <= dVar12) || (dVar13 <= local_2f0)) {
                uStack_330 = 0;
                local_328 = (double)CONCAT44(uVar11,uVar10);
                uStack_320 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
              }
              else {
                uStack_330 = 0;
                local_328 = (double)CONCAT44(uVar11,uVar10);
                uStack_320 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
                if (local_2f0 <= (double)CONCAT44(uVar11,uVar10) &&
                    (double)CONCAT44(uVar11,uVar10) != local_2f0) {
                  ON_BezierCurve::~ON_BezierCurve((ON_BezierCurve *)local_318);
                  return dVar5;
                }
              }
            }
            bVar6 = false;
          } while (bVar4);
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->m_cv_count);
      }
      local_308 = (ON_3dPoint *)0x0;
      if (__return_storage_ptr__ != (ON_3dVector *)local_138) {
        onfree(__return_storage_ptr__);
      }
      ON_BezierCurve::~ON_BezierCurve((ON_BezierCurve *)local_318);
      pOVar8 = local_2f8;
      if ((dVar12 < local_328) && (local_338 < local_328)) {
        local_2f8->z = local_2a8.z;
        local_2f8->x = local_2a8.x;
        local_2f8->y = local_2a8.y;
        local_2f8[1].z = local_290.z;
        local_2f8[1].x = local_290.x;
        local_2f8[1].y = local_290.y;
        local_2f8[2].z = local_278.z;
        local_2f8[2].x = local_278.x;
        local_2f8[2].y = local_278.y;
        local_2f8[3].x = local_260.x;
        local_2f8[3].y = local_260.y;
        local_2f8[3].z = local_260.z;
        uVar3 = -(ulong)(dVar12 < local_338) & (ulong)local_338;
        uVar10 = (undefined4)uVar3;
        uVar11 = (undefined4)(uVar3 >> 0x20);
        goto LAB_0053fb4a;
      }
    }
    pOVar8->z = local_218.z;
    pOVar8->x = local_218.x;
    pOVar8->y = local_218.y;
    pOVar8[1].z = local_200.z;
    pOVar8[1].x = local_200.x;
    pOVar8[1].y = local_200.y;
    pOVar8[2].z = local_1d8;
    pOVar8[2].x = local_1e8;
    pOVar8[2].y = dStack_1e0;
    pOVar8[3].x = local_1d0.x;
    pOVar8[3].y = local_1d0.y;
    pOVar8[3].z = local_1d0.z;
    local_360 = (double)(-(ulong)(dVar12 < local_328) & (ulong)local_328);
  }
  return local_360;
}

Assistant:

double ON_NurbsCurve::GetCubicBezierApproximation(
  double max_deviation,
  ON_3dPoint bezCV[4]
) const
{
  const double failed_rc = ON_DBL_QNAN;

  if (ThisIsNullptr(false))
    return failed_rc;
  if (m_order < 2)
    return failed_rc;
  if (m_cv_count < m_order)
    return failed_rc;
  if ( nullptr == bezCV)
    return failed_rc;

  if (
    0 == m_is_rat
    && 4 == m_order
    && 4 == m_cv_count
    && m_knot[0] == m_knot[2]
    && m_knot[3] == m_knot[5]
    )
  {
    GetCV(0, bezCV[0]);
    GetCV(1, bezCV[1]);
    GetCV(2, bezCV[2]);
    GetCV(3, bezCV[3]);
    return 0.0;
  }

  const ON_Interval domain = Domain();


  // bez0CV[] are cubic bezier control points set from end locations and interpolating 2 interior points.
  ON_3dPoint bez0CV[4] = { ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin };
  // bez1CV[] are cubic bezier control points set from end locations and derivatives.
  ON_3dPoint bez1CV[4] = { ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin };

  // bez1CV[] are cubic bezier control points set from end locations and derivatives.
  Evaluate(domain[0], 1, 3, &bez1CV[0].x, 0, nullptr);
  Evaluate(domain[1], 1, 3, &bez1CV[2].x, 0, nullptr);
  bez0CV[0] = bez1CV[0];
  bez0CV[3] = bez1CV[2];
  const double c = domain[1] - domain[0];
  const ON_3dVector D[2]{ c * bez1CV[1], c * bez1CV[3] };
  bez1CV[1] = bez0CV[0] + D[0]/3.0;
  bez1CV[2] = bez0CV[3] - D[1]/3.0;
  bez1CV[3] = bez0CV[3];

  // bez0CV[] are cubic bezier control points set from end locations and interpolating 2 interior points.
  ON_3dPoint P[2] = {ON_3dPoint::Origin,ON_3dPoint::Origin};
  int hint = 0;
  Evaluate(domain.ParameterAt(1.0/3.0), 0, 3, &P[0].x, 0, &hint);
  Evaluate(domain.ParameterAt(2.0/3.0), 0, 3, &P[1].x, 0, &hint);
  bez0CV[1] = (bez0CV[3] - 2.5*bez0CV[0])/3.0 + (3.0*P[0] - 1.5*P[1]);
  bez0CV[2] = (bez0CV[0] - 2.5*bez0CV[3])/3.0 + (3.0*P[1] - 1.5*P[0]);

  double zero_tol = 0.0;
  double deviation0 = 0.0;
  double deviation1 = 0.0;
  if (4 != m_order || 4 != m_cv_count || 0 != m_is_rat)
  {
    // g[] = parameters for evaluation test
    double g32[32];
    double* g = (m_cv_count <= 32) ? g32 : (double*)onmalloc(m_cv_count * sizeof(g[0]));
    GetGrevilleAbcissae(g);
    if (3 == m_order)
    {
      const double* k = m_knot;
      if (k[0] < k[2])
      {
        g[0] = k[2];
        g[1] = (2.0*k[2] + k[3]) / 3.0;
      }
      k += (m_cv_count - m_order);
      if (k[3] < k[5])
      {
        g[m_cv_count - 1] = k[3];
        g[m_cv_count - 2] = (2.0*k[3] + k[2]) / 3.0;
      }
    }
  
    // test evaluation
    ON_BezierCurve bez;
    bez.m_dim = 3;
    bez.m_is_rat = 0;
    bez.m_order = 4;
    bez.m_cv_stride = 3;
    bez.m_cv = &bez0CV[0].x;

    ON_3dPoint A, B;
    bez.Evaluate(1.0 / 3.0, 0, 3, &A.x);
    bez.Evaluate(2.0 / 3.0, 0, 3, &B.x);
    zero_tol = 16.0*(P[0].DistanceTo(A) + P[1].DistanceTo(B)) + 1.0e-14;
    double d;
    for (int i = 1; i < m_cv_count; i++)
    {
      for (int pass = 0; pass < 2; pass++)
      {
        const double t = (0==pass) ? 0.5*(g[i - 1] + g[i]) : g[i];
        const double s = domain.NormalizedParameterAt(t);
        if (false == (s > 0.0 && s < 1.0))
          continue;

        Evaluate(t, 0, 3, &A.x, 0, &hint);

        // test bez0CV[]
        bez.m_cv = &bez0CV[0].x;
        bez.Evaluate(s, 0, 3, &B.x);
        d = A.DistanceTo(B);
        if (d > deviation0)
          deviation0 = d;

        // test bez1CV[]
        bez.m_cv = &bez1CV[0].x;
        bez.Evaluate(s, 0, 3, &B.x);
        d = A.DistanceTo(B);
        if (d > deviation1)
          deviation1 = d;

        if (max_deviation > zero_tol && deviation0 > max_deviation && deviation1 > max_deviation)
          return failed_rc;
      }
    }

    bez.m_cv = nullptr;

    if (g != g32)
      onfree(g);
  }


  if (deviation1 <= zero_tol || deviation1 <= deviation0)
  {
    // use cubic bezier CVs calculated from end locations and interpolating end derivatives.
    bezCV[0] = bez1CV[0];
    bezCV[1] = bez1CV[1];
    bezCV[2] = bez1CV[2];
    bezCV[3] = bez1CV[3];
    return (deviation1 > zero_tol) ? deviation1 : 0.0;
  }

  // use cubic bezier CVs calculated from end locations and interpolating 2 interior points.
  bezCV[0] = bez0CV[0];
  bezCV[1] = bez0CV[1];
  bezCV[2] = bez0CV[2];
  bezCV[3] = bez0CV[3];
  return (deviation0 > zero_tol) ? deviation0 : 0.0;
}